

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O2

void __thiscall cpp_db::transaction::transaction(transaction *this,connection *conn)

{
  element_type *peVar1;
  runtime_error *this_00;
  _Head_base<0UL,_cpp_db::transaction_interface_*,_false> local_20;
  
  std::__weak_ptr<cpp_db::connection_interface,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<cpp_db::connection_interface,void>
            ((__weak_ptr<cpp_db::connection_interface,(__gnu_cxx::_Lock_policy)2> *)this,
             &(conn->conn_impl).
              super___shared_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>);
  peVar1 = (conn->driver_impl).
           super___shared_ptr<cpp_db::driver_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_driver_interface[6])(&local_20,peVar1,&conn->conn_impl);
  std::__shared_ptr<cpp_db::transaction_interface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cpp_db::transaction_interface,std::default_delete<cpp_db::transaction_interface>,void>
            ((__shared_ptr<cpp_db::transaction_interface,(__gnu_cxx::_Lock_policy)2> *)
             &this->trans_impl,
             (unique_ptr<cpp_db::transaction_interface,_std::default_delete<cpp_db::transaction_interface>_>
              *)&local_20);
  if (local_20._M_head_impl != (transaction_interface *)0x0) {
    (*(local_20._M_head_impl)->_vptr_transaction_interface[1])();
  }
  if ((this->trans_impl).
      super___shared_ptr<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"No transaction object from driver!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

transaction::transaction(const connection &conn)
    : conn_impl(conn.conn_impl)
    , trans_impl(conn.driver_impl->make_transaction(conn.conn_impl))
{
	if (!trans_impl)
		throw std::runtime_error("No transaction object from driver!");
}